

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O2

void init_keycodes(SWindowData_X11 *window_data_x11)

{
  short sVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 1) {
    g_keycodes[lVar3] = -1;
  }
  uVar4 = 8;
  do {
    if (uVar4 == 0x100) {
      return;
    }
    iVar2 = XkbKeycodeToKeysym(window_data_x11->display,uVar4 & 0xff,0,1);
    switch(iVar2) {
    case 0xffac:
    case 0xffae:
      sVar1 = 0x14a;
      break;
    case 0xffad:
    case 0xffaf:
    case 0xffba:
    case 0xffbb:
    case 0xffbc:
switchD_00102ef6_caseD_ffad:
      sVar1 = -1;
      break;
    case 0xffb0:
      sVar1 = 0x140;
      break;
    case 0xffb1:
      sVar1 = 0x141;
      break;
    case 0xffb2:
      sVar1 = 0x142;
      break;
    case 0xffb3:
      sVar1 = 0x143;
      break;
    case 0xffb4:
      sVar1 = 0x144;
      break;
    case 0xffb5:
      sVar1 = 0x145;
      break;
    case 0xffb6:
      sVar1 = 0x146;
      break;
    case 0xffb7:
      sVar1 = 0x147;
      break;
    case 0xffb8:
      sVar1 = 0x148;
      break;
    case 0xffb9:
      sVar1 = 0x149;
      break;
    case 0xffbd:
      sVar1 = 0x150;
      break;
    default:
      if (iVar2 != 0xff8d) goto switchD_00102ef6_caseD_ffad;
      sVar1 = 0x14f;
    }
    g_keycodes[uVar4] = sVar1;
    if (sVar1 == -1) {
      iVar2 = XkbKeycodeToKeysym(window_data_x11->display,uVar4 & 0xff,0,0);
      switch(iVar2) {
      case 0xff50:
        sVar1 = 0x10c;
        break;
      case 0xff51:
        sVar1 = 0x107;
        break;
      case 0xff52:
        sVar1 = 0x109;
        break;
      case 0xff53:
        sVar1 = 0x106;
        break;
      case 0xff54:
        sVar1 = 0x108;
        break;
      case 0xff55:
        sVar1 = 0x10a;
        break;
      case 0xff56:
        sVar1 = 0x10b;
        break;
      case 0xff57:
        sVar1 = 0x10d;
        break;
      case 0xff58:
      case 0xff59:
      case 0xff5a:
      case 0xff5b:
      case 0xff5c:
      case 0xff5d:
      case 0xff5e:
      case 0xff5f:
      case 0xff60:
      case 0xff62:
      case 0xff64:
      case 0xff65:
      case 0xff66:
      case 0xff68:
      case 0xff69:
      case 0xff6a:
      case 0xff6b:
      case 0xff6c:
      case 0xff6d:
      case 0xff6e:
      case 0xff6f:
      case 0xff70:
      case 0xff71:
      case 0xff72:
      case 0xff73:
      case 0xff74:
      case 0xff75:
      case 0xff76:
      case 0xff77:
      case 0xff78:
      case 0xff79:
      case 0xff7a:
      case 0xff7b:
      case 0xff7c:
      case 0xff7d:
      case 0xff80:
      case 0xff81:
      case 0xff82:
      case 0xff83:
      case 0xff84:
      case 0xff85:
      case 0xff86:
      case 0xff87:
      case 0xff88:
      case 0xff89:
      case 0xff8a:
      case 0xff8b:
      case 0xff8c:
      case 0xff8e:
      case 0xff8f:
      case 0xff90:
      case 0xff91:
      case 0xff92:
      case 0xff93:
      case 0xff94:
      case 0xff9d:
      case 0xffa0:
      case 0xffa1:
      case 0xffa2:
      case 0xffa3:
      case 0xffa4:
      case 0xffa5:
      case 0xffa6:
      case 0xffa7:
      case 0xffa8:
      case 0xffa9:
      case 0xffac:
      case 0xffae:
      case 0xffb0:
      case 0xffb1:
      case 0xffb2:
      case 0xffb3:
      case 0xffb4:
      case 0xffb5:
      case 0xffb6:
      case 0xffb7:
      case 0xffb8:
      case 0xffb9:
      case 0xffba:
      case 0xffbb:
      case 0xffbc:
      case 0xffd7:
      case 0xffd8:
      case 0xffd9:
      case 0xffda:
      case 0xffdb:
      case 0xffdc:
      case 0xffdd:
      case 0xffde:
      case 0xffdf:
      case 0xffe0:
      case 0xffe6:
switchD_00102f93_caseD_ff58:
        sVar1 = -1;
        break;
      case 0xff61:
        sVar1 = 0x11b;
        break;
      case 0xff63:
        sVar1 = 0x104;
        break;
      case 0xff67:
        sVar1 = 0x15c;
        break;
      case 0xff7e:
      case 0xffe8:
      case 0xffea:
switchD_00102f93_caseD_ff7e:
        sVar1 = 0x15a;
        break;
      case 0xff7f:
        sVar1 = 0x11a;
        break;
      case 0xff8d:
        sVar1 = 0x14f;
        break;
      case 0xff95:
        sVar1 = 0x147;
        break;
      case 0xff96:
        sVar1 = 0x144;
        break;
      case 0xff97:
        sVar1 = 0x148;
        break;
      case 0xff98:
        sVar1 = 0x146;
        break;
      case 0xff99:
        sVar1 = 0x142;
        break;
      case 0xff9a:
        sVar1 = 0x149;
        break;
      case 0xff9b:
        sVar1 = 0x143;
        break;
      case 0xff9c:
        sVar1 = 0x141;
        break;
      case 0xff9e:
        sVar1 = 0x140;
        break;
      case 0xff9f:
        sVar1 = 0x14a;
        break;
      case 0xffaa:
        sVar1 = 0x14c;
        break;
      case 0xffab:
        sVar1 = 0x14e;
        break;
      case 0xffad:
        sVar1 = 0x14d;
        break;
      case 0xffaf:
        sVar1 = 0x14b;
        break;
      case 0xffbd:
        sVar1 = 0x150;
        break;
      case 0xffbe:
        sVar1 = 0x122;
        break;
      case 0xffbf:
        sVar1 = 0x123;
        break;
      case 0xffc0:
        sVar1 = 0x124;
        break;
      case 0xffc1:
        sVar1 = 0x125;
        break;
      case 0xffc2:
        sVar1 = 0x126;
        break;
      case 0xffc3:
        sVar1 = 0x127;
        break;
      case 0xffc4:
        sVar1 = 0x128;
        break;
      case 0xffc5:
        sVar1 = 0x129;
        break;
      case 0xffc6:
        sVar1 = 0x12a;
        break;
      case 0xffc7:
        sVar1 = 299;
        break;
      case 0xffc8:
        sVar1 = 300;
        break;
      case 0xffc9:
        sVar1 = 0x12d;
        break;
      case 0xffca:
        sVar1 = 0x12e;
        break;
      case 0xffcb:
        sVar1 = 0x12f;
        break;
      case 0xffcc:
        sVar1 = 0x130;
        break;
      case 0xffcd:
        sVar1 = 0x131;
        break;
      case 0xffce:
        sVar1 = 0x132;
        break;
      case 0xffcf:
        sVar1 = 0x133;
        break;
      case 0xffd0:
        sVar1 = 0x134;
        break;
      case 0xffd1:
        sVar1 = 0x135;
        break;
      case 0xffd2:
        sVar1 = 0x136;
        break;
      case 0xffd3:
        sVar1 = 0x137;
        break;
      case 0xffd4:
        sVar1 = 0x138;
        break;
      case 0xffd5:
        sVar1 = 0x139;
        break;
      case 0xffd6:
        sVar1 = 0x13a;
        break;
      case 0xffe1:
        sVar1 = 0x154;
        break;
      case 0xffe2:
        sVar1 = 0x158;
        break;
      case 0xffe3:
        sVar1 = 0x155;
        break;
      case 0xffe4:
        sVar1 = 0x159;
        break;
      case 0xffe5:
        sVar1 = 0x118;
        break;
      case 0xffe7:
      case 0xffe9:
        sVar1 = 0x156;
        break;
      case 0xffeb:
        sVar1 = 0x157;
        break;
      case 0xffec:
        sVar1 = 0x15b;
        break;
      default:
        switch(iVar2) {
        case 0x20:
          sVar1 = 0x20;
          break;
        case 0x21:
        case 0x22:
        case 0x23:
        case 0x24:
        case 0x25:
        case 0x26:
        case 0x28:
        case 0x29:
        case 0x2a:
        case 0x2b:
        case 0x3a:
        case 0x3e:
        case 0x3f:
        case 0x40:
        case 0x41:
        case 0x42:
        case 0x43:
        case 0x44:
        case 0x45:
        case 0x46:
        case 0x47:
        case 0x48:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4c:
        case 0x4d:
        case 0x4e:
        case 0x4f:
        case 0x50:
        case 0x51:
        case 0x52:
        case 0x53:
        case 0x54:
        case 0x55:
        case 0x56:
        case 0x57:
        case 0x58:
        case 0x59:
        case 0x5a:
        case 0x5e:
        case 0x5f:
          goto switchD_00102f93_caseD_ff58;
        case 0x27:
          sVar1 = 0x27;
          break;
        case 0x2c:
          sVar1 = 0x2c;
          break;
        case 0x2d:
          sVar1 = 0x2d;
          break;
        case 0x2e:
          sVar1 = 0x2e;
          break;
        case 0x2f:
          sVar1 = 0x2f;
          break;
        case 0x30:
          sVar1 = 0x30;
          break;
        case 0x31:
          sVar1 = 0x31;
          break;
        case 0x32:
          sVar1 = 0x32;
          break;
        case 0x33:
          sVar1 = 0x33;
          break;
        case 0x34:
          sVar1 = 0x34;
          break;
        case 0x35:
          sVar1 = 0x35;
          break;
        case 0x36:
          sVar1 = 0x36;
          break;
        case 0x37:
          sVar1 = 0x37;
          break;
        case 0x38:
          sVar1 = 0x38;
          break;
        case 0x39:
          sVar1 = 0x39;
          break;
        case 0x3b:
          sVar1 = 0x3b;
          break;
        case 0x3c:
          sVar1 = 0xa1;
          break;
        case 0x3d:
          sVar1 = 0x3d;
          break;
        case 0x5b:
          sVar1 = 0x5b;
          break;
        case 0x5c:
          sVar1 = 0x5c;
          break;
        case 0x5d:
          sVar1 = 0x5d;
          break;
        case 0x60:
          sVar1 = 0x60;
          break;
        case 0x61:
          sVar1 = 0x41;
          break;
        case 0x62:
          sVar1 = 0x42;
          break;
        case 99:
          sVar1 = 0x43;
          break;
        case 100:
          sVar1 = 0x44;
          break;
        case 0x65:
          sVar1 = 0x45;
          break;
        case 0x66:
          sVar1 = 0x46;
          break;
        case 0x67:
          sVar1 = 0x47;
          break;
        case 0x68:
          sVar1 = 0x48;
          break;
        case 0x69:
          sVar1 = 0x49;
          break;
        case 0x6a:
          sVar1 = 0x4a;
          break;
        case 0x6b:
          sVar1 = 0x4b;
          break;
        case 0x6c:
          sVar1 = 0x4c;
          break;
        case 0x6d:
          sVar1 = 0x4d;
          break;
        case 0x6e:
          sVar1 = 0x4e;
          break;
        case 0x6f:
          sVar1 = 0x4f;
          break;
        case 0x70:
          sVar1 = 0x50;
          break;
        case 0x71:
          sVar1 = 0x51;
          break;
        case 0x72:
          sVar1 = 0x52;
          break;
        case 0x73:
          sVar1 = 0x53;
          break;
        case 0x74:
          sVar1 = 0x54;
          break;
        case 0x75:
          sVar1 = 0x55;
          break;
        case 0x76:
          sVar1 = 0x56;
          break;
        case 0x77:
          sVar1 = 0x57;
          break;
        case 0x78:
          sVar1 = 0x58;
          break;
        case 0x79:
          sVar1 = 0x59;
          break;
        case 0x7a:
          sVar1 = 0x5a;
          break;
        default:
          if (iVar2 == 0xfe03) goto switchD_00102f93_caseD_ff7e;
          if (iVar2 == 0xff08) {
            sVar1 = 0x103;
          }
          else if (iVar2 == 0xffff) {
            sVar1 = 0x105;
          }
          else if (iVar2 == 0xff0d) {
            sVar1 = 0x101;
          }
          else if (iVar2 == 0xff13) {
            sVar1 = 0x11c;
          }
          else if (iVar2 == 0xff14) {
            sVar1 = 0x119;
          }
          else if (iVar2 == 0xff1b) {
            sVar1 = 0x100;
          }
          else {
            if (iVar2 != 0xff09) goto switchD_00102f93_caseD_ff58;
            sVar1 = 0x102;
          }
        }
      }
      g_keycodes[uVar4] = sVar1;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void 
init_keycodes(SWindowData_X11 *window_data_x11) {
    size_t  i;
    int     keySym;

    // Clear keys
    for (i = 0; i < sizeof(g_keycodes) / sizeof(g_keycodes[0]); ++i) 
        g_keycodes[i] = KB_KEY_UNKNOWN;

    // Valid key code range is  [8,255], according to the Xlib manual
    for (i=8; i<=255; ++i) {
        // Try secondary keysym, for numeric keypad keys
         keySym  = XkbKeycodeToKeysym(window_data_x11->display, i, 0, 1);
         g_keycodes[i] = translateKeyCodeB(keySym);
         if (g_keycodes[i] == KB_KEY_UNKNOWN) {
            keySym = XkbKeycodeToKeysym(window_data_x11->display, i, 0, 0);
            g_keycodes[i] = translateKeyCodeA(keySym);
         }
    }
}